

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O2

void __thiscall IR::LabelInstr::LabelInstr(LabelInstr *this,JitArenaAllocator *allocator)

{
  Instr::Instr(&this->super_Instr,false);
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_01372168;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->labelRefs;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = 0;
  (this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator =
       &allocator->super_ArenaAllocator;
  this->field_0x78 = this->field_0x78 & 0xc0;
  this->m_region = (Region *)0x0;
  *(undefined8 *)&this->m_id = 0;
  *(undefined8 *)((long)&this->m_loweredBasicBlock + 4) = 0;
  *(undefined8 *)((long)&this->m_name + 4) = 0;
  *(undefined8 *)((long)&this->m_pc + 4) = 0;
  *(undefined4 *)((long)&this->m_block + 4) = 0;
  return;
}

Assistant:

LabelInstr(JitArenaAllocator * allocator) : Instr(), labelRefs(allocator), m_isLoopTop(false), m_block(nullptr), isOpHelper(false),
        m_hasNonBranchRef(false), m_region(nullptr), m_loweredBasicBlock(nullptr), m_isDataLabel(false), m_isForInExit(false)
#if DBG
        , m_noHelperAssert(false)
        , m_name(nullptr)
#endif
    {
#if DBG_DUMP
        m_id = 0;
#endif
        m_pc.pc = nullptr;
    }